

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

mat<double,_3,_3> * __thiscall
linalg::inverse<double,3>
          (mat<double,_3,_3> *__return_storage_ptr__,linalg *this,mat<double,_3,_3> *a)

{
  double local_60;
  mat<double,_3,_3> local_58;
  mat<double,_3,_3> *local_10;
  mat<double,_3,_3> *a_local;
  
  local_10 = (mat<double,_3,_3> *)this;
  adjugate<double>(&local_58,(mat<double,_3,_3> *)this);
  local_60 = determinant<double>(local_10);
  operator/(__return_storage_ptr__,&local_58,&local_60);
  return __return_storage_ptr__;
}

Assistant:

constexpr mat<T,N,N> inverse(const mat<T,N,N> & a) { return adjugate(a)/determinant(a); }